

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O0

int secp256k1_pubkey_sort(secp256k1_context *ctx,secp256k1_pubkey **pubkeys,size_t n_pubkeys)

{
  secp256k1_callback *in_RDX;
  _func_int_void_ptr_void_ptr_void_ptr *in_RSI;
  size_t in_RDI;
  secp256k1_pubkey_sort_cmp_data cmp_data;
  char *in_stack_ffffffffffffffd8;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  if (in_RDI == 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/modules/extrakeys/main_impl.h"
            ,0x147,"test condition failed: ctx != NULL");
    abort();
  }
  if (in_RSI != (_func_int_void_ptr_void_ptr_void_ptr *)0x0) {
    secp256k1_hsort(cmp_data.ctx,CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                    in_RDI,in_RSI,in_RDX);
  }
  else {
    secp256k1_callback_call(in_RDX,in_stack_ffffffffffffffd8);
  }
  return (uint)(in_RSI != (_func_int_void_ptr_void_ptr_void_ptr *)0x0);
}

Assistant:

int secp256k1_pubkey_sort(const secp256k1_context* ctx, const secp256k1_pubkey **pubkeys, size_t n_pubkeys) {
    secp256k1_pubkey_sort_cmp_data cmp_data;
    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(pubkeys != NULL);

    cmp_data.ctx = ctx;

    /* Suppress wrong warning (fixed in MSVC 19.33) */
    #if defined(_MSC_VER) && (_MSC_VER < 1933)
    #pragma warning(push)
    #pragma warning(disable: 4090)
    #endif

    secp256k1_hsort(pubkeys, n_pubkeys, sizeof(*pubkeys), secp256k1_pubkey_sort_cmp, &cmp_data);

    #if defined(_MSC_VER) && (_MSC_VER < 1933)
    #pragma warning(pop)
    #endif

    return 1;
}